

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateAccessorDeclarations
          (MessageFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  Descriptor *pDVar1;
  
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa7) == '\x01') {
    variables = &this->variables_;
    io::Printer::Print(printer,variables,"private:\nvoid _slow_mutable_$name$();\n");
    pDVar1 = FieldDescriptor::message_type(this->descriptor_);
    if (*(char *)(*(long *)(*(long *)(pDVar1 + 0x10) + 0xa0) + 0xa7) == '\x01') {
      io::Printer::Print(printer,variables,
                         "void _slow_set_allocated_$name$(\n    ::google::protobuf::Arena* message_arena, $type$** $name$);\n"
                        );
    }
    io::Printer::Print(printer,variables,"$type$* _slow_$release_name$();\npublic:\n");
  }
  (*(this->super_FieldGenerator)._vptr_FieldGenerator[0x18])(this,printer);
  if (this->dependent_field_ == false) {
    io::Printer::Print(printer,&this->variables_,
                       "$deprecated_attr$$type$* mutable_$name$();\n$deprecated_attr$$type$* $release_name$();\n$deprecated_attr$void set_allocated_$name$($type$* $name$);\n"
                      );
  }
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa7) == '\x01') {
    io::Printer::Print(printer,&this->variables_,
                       "$deprecated_attr$$type$* unsafe_arena_release_$name$();\n$deprecated_attr$void unsafe_arena_set_allocated_$name$(\n    $type$* $name$);\n"
                      );
    return;
  }
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateAccessorDeclarations(io::Printer* printer) const {
  if (SupportsArenas(descriptor_)) {
    printer->Print(variables_,
       "private:\n"
       "void _slow_mutable_$name$();\n");
    if (SupportsArenas(descriptor_->message_type())) {
      printer->Print(variables_,
       "void _slow_set_allocated_$name$(\n"
       "    ::google::protobuf::Arena* message_arena, $type$** $name$);\n");
    }
    printer->Print(variables_,
       "$type$* _slow_$release_name$();\n"
       "public:\n");
  }
  GenerateGetterDeclaration(printer);
  if (!dependent_field_) {
    printer->Print(variables_,
      "$deprecated_attr$$type$* mutable_$name$();\n"
      "$deprecated_attr$$type$* $release_name$();\n"
      "$deprecated_attr$void set_allocated_$name$($type$* $name$);\n");
  }
  if (SupportsArenas(descriptor_)) {
    printer->Print(variables_,
      "$deprecated_attr$$type$* unsafe_arena_release_$name$();\n"
      "$deprecated_attr$void unsafe_arena_set_allocated_$name$(\n"
      "    $type$* $name$);\n");
  }
}